

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

bool __thiscall
xscript::parser::ast::parse_switch_block
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  token_t_conflict tVar1;
  bool bVar2;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *parent_00;
  string *this_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args_00;
  string local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40;
  allocator<char> local_19;
  
  parent_00 = ast_node::add_child((parent->_M_t).
                                  super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
                                  .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>.
                                  _M_head_impl,BLOCK);
  if ((this->cur_token).type == TK_LEFT_BRACE) {
    next(this);
    do {
      tVar1 = (this->cur_token).type;
      if (1 < tVar1 - TK_CASE) {
        if (tVar1 == TK_RIGHT_BRACE) {
          next(this);
          return true;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"build_O2/src/CMakeFiles/xscript.dir/compiler_depend.ts",
                   &local_19);
        local_50._M_len = 0xc;
        local_50._M_str = "\'}\' expected";
        args_00._M_len = 1;
        args_00._M_array = &local_50;
        append_syntax_error(this,&local_40,0x4b2,args_00);
        this_00 = &local_40;
        goto LAB_00120070;
      }
      bVar2 = parse_switch_label(this,parent_00);
    } while (bVar2);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"build_O2/src/CMakeFiles/xscript.dir/compiler_depend.ts",
               &local_19);
    local_50._M_len = 0xc;
    local_50._M_str = "\'{\' expected";
    args._M_len = 1;
    args._M_array = &local_50;
    append_syntax_error(this,&local_70,0x4a7,args);
    this_00 = &local_70;
LAB_00120070:
    std::__cxx11::string::~string((string *)this_00);
  }
  return false;
}

Assistant:

bool ast::parse_switch_block(std::unique_ptr<ast_node>& parent) {
    std::unique_ptr<ast_node>& node = parent->add_child(BLOCK);

    if (cur_token != tokenizer::TK_LEFT_BRACE) {
        return syntax_error({"'{' expected"});
    }
    next();

    while (cur_token == tokenizer::TK_CASE || cur_token == tokenizer::TK_DEFAULT) {
        if (!parse_switch_label(node)) {
            return false;
        }
    }

    if (cur_token != tokenizer::TK_RIGHT_BRACE) {
        return syntax_error({"'}' expected"});
    }
    next();

    return true;
}